

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

char * cm_expat_XML_GetInputContext(XML_Parser parser,int *offset,int *size)

{
  char *pcVar1;
  
  if (*(long *)((long)parser + 0x218) != 0) {
    pcVar1 = *(char **)((long)parser + 0x10);
    if (pcVar1 != (char *)0x0) {
      *offset = (int)*(long *)((long)parser + 0x218) - (int)pcVar1;
      *size = *(int *)((long)parser + 0x38) - (int)pcVar1;
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

const char * XML_GetInputContext(XML_Parser parser, int *offset, int *size)
{
#ifdef XML_CONTEXT_BYTES
  if (eventPtr && buffer) {
    *offset = eventPtr - buffer;
    *size   = bufferEnd - buffer;
    return buffer;
  }
#endif /* defined XML_CONTEXT_BYTES */
  return (char *) 0;
}